

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.h
# Opt level: O2

void __thiscall
Assimp::FBX::Node::AddP70<std::__cxx11::string>
          (Node *this,string *name,string *type,string *type2,string *flags,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *more)

{
  Node n;
  allocator<char> local_161;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  string local_c0;
  Node local_a0;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"P",&local_161);
  Node(&local_a0,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::string((string *)&local_e0,(string *)name);
  std::__cxx11::string::string((string *)&local_100,(string *)type);
  std::__cxx11::string::string((string *)&local_120,(string *)type2);
  std::__cxx11::string::string((string *)&local_140,(string *)flags);
  std::__cxx11::string::string((string *)&local_160,(string *)more);
  AddProperties<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (&local_a0,&local_e0,&local_100,&local_120,&local_140,&local_160);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_e0);
  std::vector<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>::push_back
            (&this->children,&local_a0);
  ~Node(&local_a0);
  return;
}

Assistant:

void AddP70(
        const std::string& name,
        const std::string& type,
        const std::string& type2,
        const std::string& flags,
        More... more
    ) {
        Node n("P");
        n.AddProperties(name, type, type2, flags, more...);
        AddChild(n);
    }